

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_canonicalizeFunctionType(sysbvm_context_t *context,sysbvm_tuple_t functionType)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_bitflags_t flags;
  size_t i;
  sysbvm_tuple_t sVar5;
  size_t i_1;
  sysbvm_tuple_t sVar6;
  
  _Var2 = sysbvm_tuple_isKindOf(context,functionType,(context->roots).dependentFunctionTypeType);
  if (!_Var2) {
    return functionType;
  }
  uVar1 = *(ulong *)(functionType + 0x108);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar4 = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    sVar4 = 0;
  }
  sVar5 = 0;
  while( true ) {
    if (sVar4 == sVar5) {
      if ((*(sysbvm_tuple_t *)(functionType + 0x110) != 0) &&
         (_Var2 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(functionType + 0x110)),
         !_Var2)) {
        return functionType;
      }
      sVar5 = sysbvm_array_create(context,sVar4);
      for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
        sVar3 = *(sysbvm_tuple_t *)
                 (*(long *)(*(long *)(functionType + 0x108) + 0x10 + sVar6 * 8) + 0x38);
        if (sVar3 == 0) {
          sVar3 = (context->roots).anyValueType;
        }
        else {
          sVar3 = sysbvm_astLiteralNode_getValue(sVar3);
        }
        if ((sVar5 & 0xf) == 0 && sVar5 != 0) {
          *(sysbvm_tuple_t *)(sVar5 + 0x10 + sVar6 * 8) = sVar3;
        }
      }
      if (*(sysbvm_tuple_t *)(functionType + 0x110) == 0) {
        sVar4 = (context->roots).anyValueType;
      }
      else {
        sVar4 = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(functionType + 0x110));
      }
      uVar1 = *(ulong *)(functionType + 0xf8);
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        flags = (long)uVar1 >> 4;
      }
      else {
        flags = *(sysbvm_bitflags_t *)(uVar1 + 0x10);
      }
      sVar4 = sysbvm_type_createSimpleFunctionType(context,sVar5,flags,sVar4);
      return sVar4;
    }
    uVar1 = *(ulong *)(functionType + 0x108);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      sVar6 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar5 * 8);
    }
    else {
      sVar6 = 0;
    }
    _Var2 = sysbvm_astNode_isArgumentNode(context,sVar6);
    if (!_Var2) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:1002: assertion failure: sysbvm_astNode_isArgumentNode(context, node)"
                );
    }
    if (*(long *)(sVar6 + 0x28) == 0x1f) break;
    if ((*(sysbvm_tuple_t *)(sVar6 + 0x38) != 0) &&
       (_Var2 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(sVar6 + 0x38)), !_Var2)) {
      return functionType;
    }
    sVar5 = sVar5 + 1;
  }
  return functionType;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_canonicalizeFunctionType(sysbvm_context_t *context, sysbvm_tuple_t functionType)
{
    if(!sysbvm_tuple_isKindOf(context, functionType, context->roots.dependentFunctionTypeType))
        return functionType;

    sysbvm_dependentFunctionType_t *dependentFunctionType = (sysbvm_dependentFunctionType_t*)functionType;
    
    // Only accept literal values for argument types.
    size_t argumentCount = sysbvm_array_getSize(dependentFunctionType->argumentNodes);
    for(size_t i = 0; i < argumentCount; ++i)
    {
        if(!canCanonicalizeArgumentNodeType(context, sysbvm_array_at(dependentFunctionType->argumentNodes, i)))
            return functionType;
    }

    // Check the result type.
    if(dependentFunctionType->resultTypeNode && !sysbvm_astNode_isLiteralNode(context, dependentFunctionType->resultTypeNode))
        return functionType;

    sysbvm_tuple_t argumentTypes = sysbvm_array_create(context, argumentCount);
    for(size_t i = 0; i < argumentCount; ++i)
    {
        sysbvm_astArgumentNode_t *argumentNode = (sysbvm_astArgumentNode_t*)sysbvm_array_at(dependentFunctionType->argumentNodes, i);
        sysbvm_tuple_t argumentType = context->roots.anyValueType;
        if(argumentNode->type)
            argumentType = sysbvm_astLiteralNode_getValue(argumentNode->type);
        sysbvm_array_atPut(argumentTypes, i, argumentType);
    }

    sysbvm_tuple_t resultType = context->roots.anyValueType;
    if(dependentFunctionType->resultTypeNode)
        resultType = sysbvm_astLiteralNode_getValue(dependentFunctionType->resultTypeNode);

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode(dependentFunctionType->super.functionFlags);
    return sysbvm_type_createSimpleFunctionType(context, argumentTypes, flags, resultType);
}